

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# carver.cpp
# Opt level: O0

void __thiscall carver::Carver::carveImage(Carver *this,string *outputPath)

{
  _InputArray *in_RSI;
  Mat target;
  Carver *in_stack_00000508;
  Mat *in_stack_ffffffffffffff08;
  vector *pvVar1;
  vector<int,_std::allocator<int>_> *this_00;
  string local_d8 [32];
  string *message;
  Carver *this_01;
  char *__lhs;
  _InputArray local_88;
  vector<int,_std::allocator<int>_> local_70 [4];
  
  this_00 = local_70;
  carveImage(in_stack_00000508);
  cv::_InputArray::_InputArray(in_RSI,in_stack_ffffffffffffff08);
  message = (string *)0x0;
  this_01 = (Carver *)0x0;
  __lhs = (char *)0x0;
  pvVar1 = (vector *)&stack0xffffffffffffff48;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x11549b);
  cv::imwrite((string *)in_RSI,&local_88,pvVar1);
  std::vector<int,_std::allocator<int>_>::~vector(this_00);
  cv::_InputArray::~_InputArray(&local_88);
  std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01)
  ;
  log_(this_01,message);
  std::__cxx11::string::~string(local_d8);
  cv::Mat::~Mat((Mat *)local_70);
  return;
}

Assistant:

void Carver::carveImage(string outputPath) {
    cv::Mat target = carveImage();
    cv::imwrite(outputPath, target);
    log_("Saved output image as " + outputPath);
}